

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O3

void info_print_if_feature
               (lyout *out,lys_module *module,lys_iffeature *iffeature,uint8_t iffeature_size)

{
  undefined7 in_register_00000009;
  long lVar1;
  lys_iffeature *expr;
  
  ly_print(out,"%-*s",0xb,"If-feats: ");
  if ((int)CONCAT71(in_register_00000009,iffeature_size) != 0) {
    ly_print_iffeature(out,module,iffeature,1);
    ly_print(out,"\n");
    if (iffeature_size != '\x01') {
      expr = iffeature + 1;
      lVar1 = (ulong)iffeature_size - 1;
      do {
        ly_print(out,"%*s",0xb,"");
        ly_print_iffeature(out,module,expr,1);
        ly_print(out,"\n");
        expr = expr + 1;
        lVar1 = lVar1 + -1;
      } while (lVar1 != 0);
    }
    return;
  }
  ly_print(out,"\n");
  return;
}

Assistant:

static void
info_print_if_feature(struct lyout *out, const struct lys_module *module,
                      struct lys_iffeature *iffeature, uint8_t iffeature_size)
{
    int i;

    ly_print(out, "%-*s", INDENT_LEN, "If-feats: ");

    if (iffeature_size) {
        ly_print_iffeature(out, module, &iffeature[0], 1);
        ly_print(out, "\n");
        for (i = 1; i < iffeature_size; ++i) {
            ly_print(out, "%*s", INDENT_LEN, "");
            ly_print_iffeature(out, module, &iffeature[i], 1);
            ly_print(out, "\n");
        }
    } else {
        ly_print(out, "\n");
    }
}